

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O2

int query_category(char *qstr,obj *olist,int qflags,int *pick_list,int how)

{
  nh_menuitem *pnVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  char *pack;
  long lVar5;
  char cVar6;
  obj *poVar7;
  byte bVar8;
  int ccount;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  char local_1c9;
  menulist menu;
  int valid_oclasses [18];
  char buf [256];
  
  if (olist == (obj *)0x0) {
    return 0;
  }
  bVar17 = true;
  bVar16 = true;
  if ((qflags & 2U) != 0) {
    iVar4 = count_unpaid(olist);
    bVar16 = iVar4 == 0;
  }
  bVar8 = false;
  if ((char)qflags < '\0') {
    iVar4 = count_buc(olist,0x80);
    bVar17 = iVar4 == 0;
    bVar8 = !bVar17;
  }
  bVar19 = true;
  if (((uint)qflags >> 8 & 1) == 0) {
    bVar18 = true;
  }
  else {
    iVar4 = count_buc(olist,0x100);
    bVar18 = iVar4 == 0;
    bVar8 = bVar8 + !bVar18;
  }
  if (((uint)qflags >> 9 & 1) != 0) {
    iVar4 = count_buc(olist,0x200);
    bVar19 = iVar4 == 0;
    bVar8 = bVar8 + !bVar19;
  }
  bVar21 = true;
  if (((uint)qflags >> 10 & 1) == 0) {
    bVar20 = true;
  }
  else {
    iVar4 = count_buc(olist,0x400);
    bVar20 = iVar4 == 0;
    bVar8 = bVar8 + !bVar20;
  }
  if (((uint)qflags >> 0xb & 1) != 0) {
    iVar4 = count_buc(olist,0x800);
    bVar21 = iVar4 == 0;
  }
  uVar10 = (ulong)(qflags * 8 & 8);
  lVar5 = 0x312630;
  iVar4 = 0;
  cVar6 = flags.inv_order[0];
  do {
    bVar3 = false;
    for (poVar7 = olist; poVar7 != (obj *)0x0;
        poVar7 = *(obj **)((long)poVar7->oextra + (uVar10 - 100))) {
      if (poVar7->oclass == cVar6) {
        if ((qflags & 8U) == 0) {
          if (!bVar3) {
LAB_00204b28:
            iVar4 = iVar4 + 1;
          }
          bVar3 = true;
        }
        else if (!bVar3 && (poVar7->owornmask & 0xf077fU) != 0) goto LAB_00204b28;
      }
    }
    cVar6 = *(char *)(lVar5 + 1);
    lVar5 = lVar5 + 1;
  } while (cVar6 != '\0');
  if ((((qflags & 0x20U) == 0) && ((bool)(iVar4 == 1 & bVar16))) && (bVar8 < 2)) {
    for (; ((qflags & 8U) != 0 && (olist != (obj *)0x0));
        olist = *(obj **)((long)olist->oextra + (uVar10 - 100))) {
      if ((olist->owornmask & 0xf077fU) != 0) goto LAB_00204df5;
    }
    if (olist == (obj *)0x0) {
      return 0;
    }
LAB_00204df5:
    *pick_list = (int)olist->oclass;
    lVar5 = 0;
    uVar10 = 1;
  }
  else {
    init_menulist(&menu);
    local_1c9 = 'a';
    if (1 < iVar4 && (qflags & 0x10U) != 0) {
      lVar5 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar5 * 0x218);
      }
      pcVar12 = menu.items[menu.icount].caption;
      ((nh_menuitem *)(pcVar12 + -8))->id = -2;
      ((nh_menuitem *)(pcVar12 + -8))->role = MI_NORMAL;
      *(undefined2 *)(pcVar12 + 0x100) = 0x61;
      pcVar12[0x102] = '\0';
      pcVar11 = "All worn types";
      if ((qflags & 8U) == 0) {
        pcVar11 = "All types";
      }
      strcpy(pcVar12,pcVar11);
      menu.icount = menu.icount + 1;
      local_1c9 = 'b';
    }
    pcVar12 = flags.inv_order;
    iVar4 = 0;
    do {
      bVar3 = false;
      for (poVar7 = olist; lVar5 = (long)iVar4, poVar7 != (obj *)0x0;
          poVar7 = *(obj **)((long)poVar7->oextra + (uVar10 - 100))) {
        if (poVar7->oclass == *pcVar12) {
          if ((qflags & 8U) == 0) {
            if (!bVar3) {
LAB_00204c84:
              cVar6 = ""[objects[poVar7->otyp].oc_class];
              pcVar11 = let_to_name(poVar7->oclass,'\0');
              sprintf(buf,"%s  (\'%c\')",pcVar11,(ulong)(uint)(int)cVar6);
              lVar14 = (long)menu.size;
              if (menu.size <= menu.icount) {
                menu.size = menu.size * 2;
                menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
              }
              pnVar1 = menu.items + menu.icount;
              pnVar1->id = (int)poVar7->oclass;
              pnVar1->role = MI_NORMAL;
              pnVar1->accel = local_1c9;
              pnVar1->group_accel = '\0';
              pnVar1->selected = '\0';
              strcpy(pnVar1->caption,buf);
              lVar14 = (long)menu.icount;
              menu.icount = menu.icount + 1;
              menu.items[lVar14].group_accel = cVar6;
              if ((iflags.menu_match_tight != '\0') && (poVar7->oclass != 0xc)) {
                valid_oclasses[lVar5] = (int)poVar7->oclass;
                if (0x10 < iVar4) {
                  free(menu.items);
                  pcVar12 = "query_category: too many oclasses";
                  goto LAB_00204e20;
                }
                iVar4 = iVar4 + 1;
              }
              local_1c9 = local_1c9 + '\x01';
            }
            bVar3 = true;
          }
          else if (!bVar3 && (poVar7->owornmask & 0xf077fU) != 0) goto LAB_00204c84;
        }
      }
      if ('t' < local_1c9) {
        free(menu.items);
        pcVar12 = "query_category: too many categories";
LAB_00204e20:
        impossible(pcVar12);
        return 0;
      }
      pcVar11 = pcVar12 + 1;
      pcVar12 = pcVar12 + 1;
    } while (*pcVar11 != '\0');
    if (!bVar16) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      lVar14 = (long)menu.icount;
      menu.items[lVar14].id = 0x75;
      menu.items[lVar14].role = MI_NORMAL;
      menu.items[lVar14].accel = 'u';
      menu.items[lVar14].group_accel = '\0';
      menu.items[lVar14].selected = '\0';
      builtin_strncpy(menu.items[lVar14].caption,"Unpaid i",8);
      builtin_strncpy(menu.items[lVar14].caption + 5,"d items",8);
      menu.icount = menu.icount + 1;
    }
    if ((qflags & 0x20U) != 0) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      menu.items[menu.icount].id = 0x78;
      menu.items[menu.icount].role = MI_NORMAL;
      menu.items[menu.icount].accel = 'x';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Unpaid items alr",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 0xd,"already used up",0x10);
      menu.icount = menu.icount + 1;
    }
    if ((qflags & 0x40U) != 0) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      pcVar12 = menu.items[menu.icount].caption;
      ((nh_menuitem *)(pcVar12 + -8))->id = 0x41;
      ((nh_menuitem *)(pcVar12 + -8))->role = MI_NORMAL;
      *(undefined2 *)(pcVar12 + 0x100) = 0x41;
      pcVar12[0x102] = '\0';
      pcVar11 = "Auto-select every item being worn";
      if ((qflags & 8U) == 0) {
        pcVar11 = "Auto-select every item";
      }
      strcpy(pcVar12,pcVar11);
      menu.icount = menu.icount + 1;
    }
    if (!bVar21) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      menu.items[menu.icount].id = 0x49;
      menu.items[menu.icount].role = MI_NORMAL;
      menu.items[menu.icount].accel = 'I';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Unidentified Ite",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 0xf,"ems",4);
      menu.icount = menu.icount + 1;
    }
    if (!bVar17) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      menu.items[menu.icount].id = 0x42;
      menu.items[menu.icount].role = MI_NORMAL;
      menu.items[menu.icount].accel = 'B';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Items known to b",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 10,"n to be Blessed",0x10);
      menu.icount = menu.icount + 1;
    }
    if (!bVar18) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      menu.items[menu.icount].id = 0x43;
      menu.items[menu.icount].role = MI_NORMAL;
      menu.items[menu.icount].accel = 'C';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Items known to b",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 9,"wn to be Cursed",0x10);
      menu.icount = menu.icount + 1;
    }
    if (!bVar19) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      menu.items[menu.icount].id = 0x55;
      menu.items[menu.icount].role = MI_NORMAL;
      menu.items[menu.icount].accel = 'U';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Items known to b",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 0xb," to be Uncursed",0x10);
      menu.icount = menu.icount + 1;
    }
    if (!bVar20) {
      lVar14 = (long)menu.size;
      if (menu.size <= menu.icount) {
        menu.size = menu.size * 2;
        menu.items = (nh_menuitem *)realloc(menu.items,lVar14 * 0x218);
      }
      menu.items[menu.icount].id = 0x58;
      menu.items[menu.icount].role = MI_NORMAL;
      menu.items[menu.icount].accel = 'X';
      menu.items[menu.icount].group_accel = '\0';
      menu.items[menu.icount].selected = '\0';
      builtin_strncpy(menu.items[menu.icount].caption,"Items of unknown",0x10);
      builtin_strncpy(menu.items[menu.icount].caption + 0xe,"wn B/C/U status",0x10);
      menu.icount = menu.icount + 1;
    }
    uVar9 = display_menu(menu.items,menu.icount,qstr,how,pick_list);
    free(menu.items);
    uVar10 = 0;
    if (0 < (int)uVar9) {
      uVar10 = (ulong)uVar9;
    }
  }
  uVar9 = (uint)uVar10;
  if (iflags.menu_match_tight == '\0') {
    return uVar9;
  }
  if (uVar9 == 0) {
    return 0;
  }
  bVar16 = false;
  bVar17 = false;
  bVar21 = false;
  bVar19 = false;
  bVar18 = false;
  for (uVar13 = 0; uVar13 != uVar10; uVar13 = uVar13 + 1) {
    iVar4 = pick_list[uVar13];
    lVar14 = 0;
    while ((lVar14 < lVar5 && (!bVar21))) {
      piVar2 = valid_oclasses + lVar14;
      lVar14 = lVar14 + 1;
      bVar21 = iVar4 == *piVar2;
    }
    uVar15 = (ulong)(iVar4 - 0x41U);
    if (iVar4 - 0x41U < 0x38) {
      if ((0x90000000900106U >> (uVar15 & 0x3f) & 1) == 0) {
        if (uVar15 == 0) {
          bVar18 = true;
        }
        else {
          if (uVar15 != 0x20) goto LAB_002052a5;
          bVar16 = true;
        }
      }
      else {
        bVar19 = true;
      }
    }
    else {
LAB_002052a5:
      if (iVar4 == 0xc) {
        bVar17 = true;
      }
    }
  }
  if (bVar16) {
    return uVar9;
  }
  if ((!bVar21 && !bVar19) && bVar17) {
    return uVar9;
  }
  bVar18 = !bVar18;
  if ((uVar9 < 0x1e) || (bVar21 && (bVar19 && (((bVar17 || bVar21) || bVar19) || bVar18)))) {
    uVar13 = uVar10;
    if (((!bVar17 && !bVar21) && !bVar19) && !bVar18) {
      uVar13 = (ulong)(uVar9 + 1);
      pick_list[uVar10] = 0xc;
    }
    uVar9 = (uint)uVar13;
    if ((int)uVar9 < 0x1e || bVar21 && (bVar19 && (((bVar17 || bVar21) || bVar19) || bVar18))) {
      if (((!bVar17 && !bVar21) && !bVar19) && !bVar18 || !bVar21) {
        for (lVar14 = 0; (uVar10 = uVar13 + lVar14, lVar14 < lVar5 && (uVar10 < 0x1e));
            lVar14 = lVar14 + 1) {
          pick_list[uVar13 + lVar14] = valid_oclasses[lVar14];
        }
        uVar13 = uVar10;
        if ((0x1d < uVar10) &&
           ((!bVar19 || ((!bVar17 && !bVar21) && !bVar19) && !bVar18) || lVar14 < lVar5)) {
          pcVar12 = "oclasses";
          uVar9 = (uint)uVar10;
          goto LAB_00205339;
        }
      }
      iVar4 = (int)uVar13;
      if (bVar19) {
        return iVar4;
      }
      uVar9 = iVar4 + 1;
      pick_list[iVar4] = 0x42;
      pcVar12 = "BUCs";
      if (iVar4 < 0x1d) {
        pick_list[(int)uVar9] = 0x43;
        uVar9 = 0x1e;
        if ((iVar4 != 0x1c) && (pick_list[(long)iVar4 + 2] = 0x55, iVar4 < 0x1b)) {
          pick_list[(long)iVar4 + 3] = 0x58;
          return iVar4 + 4;
        }
      }
    }
    else {
      pcVar12 = "COIN_CLASS";
    }
  }
  else {
    pcVar12 = "anything";
  }
LAB_00205339:
  warning("query_category: no room in pick_list to add %s",pcVar12);
  return uVar9;
}

Assistant:

int query_category(const char *qstr,	/* query string */
		   struct obj *olist,	/* the list to pick from */
		   int qflags,		/* behaviour modification flags */
		   int *pick_list,	/* return list of items picked */
		   int how)		/* type of query */
{
	int n;
	struct obj *curr;
	char *pack;
	boolean collected_type_name;
	char invlet;
	int ccount;
	boolean do_unpaid = FALSE;
	boolean do_blessed = FALSE, do_cursed = FALSE, do_uncursed = FALSE,
	    do_buc_unknown = FALSE, do_unidentified = FALSE;
	int num_buc_types = 0;
	struct menulist menu;
	int valid_oclasses[MAXOCLASSES]; /* excludes COIN_CLASS */
	int num_valid_oclasses = 0;

	if (!olist)
	    return 0;
	if ((qflags & UNPAID_TYPES) && count_unpaid(olist))
	    do_unpaid = TRUE;
	if ((qflags & BUC_BLESSED) && count_buc(olist, BUC_BLESSED)) {
	    do_blessed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_CURSED) && count_buc(olist, BUC_CURSED)) {
	    do_cursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNCURSED) && count_buc(olist, BUC_UNCURSED)) {
	    do_uncursed = TRUE;
	    num_buc_types++;
	}
	if ((qflags & BUC_UNKNOWN) && count_buc(olist, BUC_UNKNOWN)) {
	    do_buc_unknown = TRUE;
	    num_buc_types++;
	}
	if ((qflags & UNIDENTIFIED) && count_buc(olist, UNIDENTIFIED))
	    do_unidentified = TRUE;

	ccount = count_categories(olist, qflags);
	/* no point in actually showing a menu for a single category */
	if (ccount == 1 && !do_unpaid && num_buc_types <= 1 &&
	    !(qflags & BILLED_TYPES)) {
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if ((qflags & WORN_TYPES) &&
		    !(curr->owornmask & (W_ARMOR|W_RING|W_AMUL|W_TOOL|W_WEP|W_SWAPWEP|W_QUIVER)))
		    continue;
		break;
	    }
	    if (curr) {
		pick_list[0] = curr->oclass;
		n = 1;
		goto fudge_choices;
	    }
	    return 0;
	}
	
	init_menulist(&menu);

	pack = flags.inv_order;
	invlet = 'a';
	if ((qflags & ALL_TYPES) && (ccount > 1)) {
		add_menuitem(&menu, ALL_TYPES_SELECTED, (qflags & WORN_TYPES) ?
		             "All worn types" : "All types", invlet, FALSE);
		invlet = 'b';
	}
	
	do {
	    collected_type_name = FALSE;
	    for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
		if (curr->oclass == *pack) {
		   if ((qflags & WORN_TYPES) &&
		   		!(curr->owornmask & (W_ARMOR | W_RING | W_AMUL | W_TOOL |
		    	W_WEP | W_SWAPWEP | W_QUIVER)))
			 continue;
		   if (!collected_type_name) {
			char oc_sym, buf[BUFSZ];
			oc_sym = def_oc_syms[(int)objects[curr->otyp].oc_class];
			sprintf(buf, "%s  ('%c')", let_to_name(*pack, FALSE), oc_sym);
			add_menuitem(&menu, curr->oclass, buf, invlet++, FALSE);
			menu.items[menu.icount - 1].group_accel = oc_sym;
			collected_type_name = TRUE;
			/* Gold is handled separately. */
			if (iflags.menu_match_tight && curr->oclass != COIN_CLASS) {
			    valid_oclasses[num_valid_oclasses++] = curr->oclass;
			    if (num_valid_oclasses >= MAXOCLASSES) {
				free(menu.items);
				impossible("query_category: too many oclasses");
				return 0;
			    }
			}
		   }
		}
	    }
	    pack++;
	    if (invlet >= 'u') {
		free(menu.items);
		impossible("query_category: too many categories");
		return 0;
	    }
	} while (*pack);
	/* unpaid items if there are any */
	if (do_unpaid)
	    add_menuitem(&menu, 'u', "Unpaid items", 'u', FALSE);
	
	/* billed items: checked by caller, so always include if BILLED_TYPES */
	if (qflags & BILLED_TYPES)
	    add_menuitem(&menu, 'x', "Unpaid items already used up", 'x', FALSE);
	
	if (qflags & CHOOSE_ALL)
	    add_menuitem(&menu, 'A', (qflags & WORN_TYPES) ?
		    "Auto-select every item being worn" :
		    "Auto-select every item", 'A', FALSE);
	
	if (do_unidentified)
	    add_menuitem(&menu, 'I', "Unidentified Items", 'I', FALSE);
	
	/* items with b/u/c/unknown if there are any */
	if (do_blessed)
	    add_menuitem(&menu, 'B', "Items known to be Blessed", 'B', FALSE);
	
	if (do_cursed)
	    add_menuitem(&menu, 'C', "Items known to be Cursed", 'C', FALSE);
	
	if (do_uncursed)
	    add_menuitem(&menu, 'U', "Items known to be Uncursed", 'U', FALSE);
	
	if (do_buc_unknown)
	    add_menuitem(&menu, 'X', "Items of unknown B/C/U status", 'X', FALSE);
	
	n = display_menu(menu.items, menu.icount, qstr, how, pick_list);
	free(menu.items);
	if (n < 0)
	    n = 0;	/* callers don't expect -1 */

	/*
	 * Fudge menu choices since allow_category() requires at least
	 * an object class and some object property to show anything.
	 *
	 * - Choosing all [a] goes through allow_all(), which skips all of this.
	 * - Choosing gold [$] always shows gold, since it's not subjected
	 *   the usual property checks.
	 * - Choosing only gold [$] excludes all other objects.
	 * - Auto-select all with nothing else includes gold and all objects.
	 * - Choosing classes w/out properties auto-matches any BUC to match
	 *   all objects of that class.
	 * - Choosing properties w/out classes auto-matches all classes to match
	 *   all objects with those properties.
	 */
fudge_choices:
	if (iflags.menu_match_tight && n > 0) {
	    boolean all_chosen = FALSE;
	    boolean gold_chosen = FALSE;
	    boolean oclass_chosen = FALSE;
	    boolean oprop_chosen = FALSE;
	    boolean autosel_chosen = FALSE;
	    boolean add_gold = FALSE;
	    boolean add_oclasses = FALSE;
	    boolean add_bucs = FALSE;
	    const char *failed_at = NULL; /* 30 == hard-coded pick_list[] length */
	    int i, j;

	    /* Analyze menu choices. */
	    for (i = 0; i < n; i++) {
		int pick = pick_list[i];
		for (j = 0; j < num_valid_oclasses && !oclass_chosen; j++) {
		    if (pick == valid_oclasses[j])
			oclass_chosen = TRUE;
		}
		switch (pick) {
		case 'a':
		    all_chosen = TRUE;
		    break;
		case COIN_CLASS:
		    gold_chosen = TRUE;
		    break;
		case 'B': case 'C': case 'U': case 'X':
		case 'u': case 'x': case 'I':
		    oprop_chosen = TRUE;
		    break;
		case 'A':
		    autosel_chosen = TRUE;
		    break;
		}
	    }

	    /* Choosing all [a] means no special fudging is needed. */
	    if (all_chosen)
		return n;

	    /* If only gold is chosen, don't show anything else. */
	    if (gold_chosen && !(oclass_chosen || oprop_chosen))
		return n;

	    if (autosel_chosen && !(gold_chosen || oclass_chosen || oprop_chosen)) {
		/* If only auto-select all is chosen, add everything. */
		add_gold = TRUE;
		add_oclasses = TRUE;
		add_bucs = TRUE;
	    } else {
		/* Add all oclasses if needed. */
		if (!oclass_chosen)
		    add_oclasses = TRUE;
		/* Add all BUCs if no oprops were chosen. */
		if (!oprop_chosen)
		    add_bucs = TRUE;
	    }

	    if (n >= 30 && (add_gold || add_oclasses || add_bucs)) {
		failed_at = "anything";
		goto append_fail;
	    }

	    if (add_gold)
		pick_list[n++] = COIN_CLASS;
	    if (n >= 30 && (add_oclasses || add_bucs)) {
		failed_at = "COIN_CLASS";
		goto append_fail;
	    }

	    if (add_oclasses) {
		for (j = 0; j < num_valid_oclasses && n < 30; j++)
		    pick_list[n++] = valid_oclasses[j];
		if (n >= 30 && (j < num_valid_oclasses || add_bucs)) {
		    failed_at = "oclasses";
		    goto append_fail;
		}
	    }

	    if (add_bucs) {
		pick_list[n++] = 'B';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'C';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'U';
		if (n >= 30) {
		    failed_at = "BUCs";
		    goto append_fail;
		}
		pick_list[n++] = 'X';
	    }

append_fail:
	    if (failed_at)
		warning("query_category: no room in pick_list to add %s", failed_at);
	}

	return n;
}